

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O2

void __thiscall FString::FString(FString *this,char *copyStr)

{
  char *__dest;
  size_t len;
  
  if ((copyStr == (char *)0x0) || (*copyStr == '\0')) {
    NullString.RefCount = NullString.RefCount + 1;
    this->Chars = (char *)0x71deec;
  }
  else {
    len = strlen(copyStr);
    AllocBuffer(this,len);
    __dest = this->Chars;
    memcpy(__dest,copyStr,len);
    __dest[len] = '\0';
  }
  return;
}

Assistant:

FString::FString (const char *copyStr)
{
	if (copyStr == NULL || *copyStr == '\0')
	{
		NullString.RefCount++;
		Chars = &NullString.Nothing[0];
	}
	else
	{
		size_t len = strlen (copyStr);
		AllocBuffer (len);
		StrCopy (Chars, copyStr, len);
	}
}